

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

void __thiscall FStateDefinitions::AddStateDefines(FStateDefinitions *this,FStateLabels *list)

{
  FStateDefine *pFVar1;
  FStateLabel *pFVar2;
  long lVar3;
  FName local_5c;
  FStateDefine local_58;
  
  if (list != (FStateLabels *)0x0) {
    pFVar2 = list->Labels;
    for (lVar3 = 0; lVar3 < list->NumLabels; lVar3 = lVar3 + 1) {
      if (pFVar2->Children == (FStateLabels *)0x0) {
        local_5c.Index = (pFVar2->Label).Index;
        pFVar1 = FindStateLabelInList(&this->StateLabels,&local_5c,false);
        if (pFVar1 == (FStateDefine *)0x0) {
          local_58.Children.Array = (FStateDefine *)0x0;
          local_58.Children.Most = 0;
          local_58.Children.Count = 0;
          local_58.Label.Index = (pFVar2->Label).Index;
          local_58.State = pFVar2->State;
          local_58.DefineFlags = '\x01';
          TArray<FStateDefine,_FStateDefine>::Push(&this->StateLabels,&local_58);
          TArray<FStateDefine,_FStateDefine>::~TArray(&local_58.Children);
        }
      }
      pFVar2 = pFVar2 + 1;
    }
  }
  return;
}

Assistant:

void FStateDefinitions::AddStateDefines(const FStateLabels *list)
{
	if (list != NULL) for(int i = 0; i < list->NumLabels; i++)
	{
		if (list->Labels[i].Children == NULL)
		{
			if (!FindStateLabelInList(StateLabels, list->Labels[i].Label, false))
			{
				FStateDefine def;

				def.Label = list->Labels[i].Label;
				def.State = list->Labels[i].State;
				def.DefineFlags = SDF_STATE;
				StateLabels.Push(def);
			}
		}
	}
}